

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  ErrorFormat EVar1;
  size_type sVar2;
  node_type *pnVar3;
  Descriptor *pDVar4;
  _func_int **pp_Var5;
  node_type *pnVar6;
  GeneratorContextImpl *this_00;
  pointer pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  _func_int ***ppp_Var10;
  _Head_base<0UL,_google::protobuf::DescriptorPool_*,_false> _Var11;
  undefined8 uVar12;
  pointer ppFVar13;
  pointer puVar14;
  bool bVar15;
  ParseArgumentStatus PVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  ostream *poVar20;
  char *pcVar21;
  size_t sVar22;
  _Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false> this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar23;
  DiskSourceTree *this_02;
  MultiFileErrorCollector *pMVar24;
  SourceTreeDescriptorDatabase *pSVar25;
  DescriptorPool *pDVar26;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *proto;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar27;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *pVVar28;
  reference filename;
  pointer pOVar29;
  MultiFileErrorCollector *pMVar30;
  void *pvVar31;
  FileDescriptor *pFVar32;
  anon_union_8_1_a8a14541_for_iterator_2 arena;
  Arena *arena_00;
  ErrorCollector *error_collector_00;
  DiskSourceTree *source_tree;
  FieldDescriptorProto *proto_01;
  pointer pbVar33;
  CommandLineInterface *pCVar34;
  undefined1 *puVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  pointer __p;
  __base_type _Var39;
  ulong uVar40;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  _Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false> _Var41;
  Chunk *pCVar42;
  long lVar43;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  string_view value;
  string_view value_00;
  string_view str;
  bool validation_error;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  descriptor_pool;
  unique_ptr<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
  error_collector;
  GeneratorContextMap output_directories;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  FileDescriptorSet file_descriptor_set;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  OptionTargetType in_stack_fffffffffffffda8;
  ctrl_t local_249;
  SourceTreeDescriptorDatabase *local_248;
  DiskSourceTree *local_240;
  _Head_base<0UL,_google::protobuf::DescriptorPool_*,_false> local_238;
  MultiFileErrorCollector *local_230;
  MergedDescriptorDatabase *local_228;
  CommandLineInterface *local_220;
  undefined1 local_218 [32];
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_1f8;
  pointer local_1e0;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  local_1d8;
  pointer local_1b8;
  undefined1 local_1b0 [40];
  RepeatedPtrFieldBase local_188 [3];
  undefined1 local_138 [72];
  RepeatedPtrFieldBase local_f0;
  RepeatedPtrFieldBase local_d8;
  RepeatedPtrFieldBase local_c0 [3];
  ArenaStringPtr local_70 [6];
  LogMessageFatal local_40;
  
  Clear(this);
  local_220 = this;
  PVar16 = ParseArguments(this,argc,argv);
  if (PVar16 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar16 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  local_1f8.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230 = (MultiFileErrorCollector *)0x0;
  local_238._M_head_impl = (DescriptorPool *)0x0;
  local_228 = (MergedDescriptorDatabase *)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar33 = (local_220->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (local_220->descriptor_set_in_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar33 != local_1e0) {
LAB_0018102b:
    do {
      iVar17 = open((pbVar33->_M_dataplus)._M_p,0);
      if (iVar17 < 0) {
        piVar19 = __errno_location();
        if (*piVar19 == 4) goto LAB_0018102b;
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar33->_M_dataplus)._M_p,
                             pbVar33->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,": ",2);
        pcVar21 = strerror(2);
        if (pcVar21 == (char *)0x0) {
          std::ios::clear((int)poVar20 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
        }
        else {
          sVar22 = strlen(pcVar21);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar21,sVar22);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
        std::ostream::put((char)poVar20);
        std::ostream::flush();
        local_218._0_8_ =
             (__uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
              )0x0;
      }
      else {
        FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_1b0,(Arena *)0x0);
        bVar15 = MessageLite::ParseFromFileDescriptor((MessageLite *)local_1b0,iVar17);
        iVar17 = close(iVar17);
        if (iVar17 == 0) {
          if (!bVar15) {
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(pbVar33->_M_dataplus)._M_p,
                                 pbVar33->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,": Unable to parse.",0x12);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
            std::ostream::put((char)poVar20);
            std::ostream::flush();
            goto LAB_001812e7;
          }
          this_01._M_head_impl = (SimpleDescriptorDatabase *)operator_new(0x68);
          SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_01._M_head_impl);
          if (0 < local_188[0].current_size_) {
            iVar17 = 0;
            do {
              FileDescriptorProto::FileDescriptorProto
                        ((FileDescriptorProto *)local_138,(Arena *)0x0);
              pVVar23 = protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                                  (local_188,iVar17);
              iVar18 = (*((this_01._M_head_impl)->super_DescriptorDatabase)._vptr_DescriptorDatabase
                         [2])(this_01._M_head_impl,
                              (ulong)(pVVar23->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc,(FileDescriptorProto *)local_138);
              iVar38 = 6;
              if ((char)iVar18 == '\0') {
                pVVar23 = protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                                    (local_188,iVar17);
                bVar15 = SimpleDescriptorDatabase::Add(this_01._M_head_impl,pVVar23);
                iVar38 = 0;
                if (!bVar15) {
                  local_218._0_8_ = (FileDescriptor *)0x0;
                  iVar38 = 1;
                }
              }
              FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_138);
              if ((iVar38 != 6) && (_Var41._M_head_impl = this_01._M_head_impl, iVar38 != 0))
              goto LAB_001811f0;
              iVar17 = iVar17 + 1;
            } while (iVar17 < local_188[0].current_size_);
          }
          _Var41._M_head_impl = (SimpleDescriptorDatabase *)0x0;
          local_218._0_8_ = this_01._M_head_impl;
LAB_001811f0:
          if (_Var41._M_head_impl != (SimpleDescriptorDatabase *)0x0) {
            (**(code **)(*(long *)_Var41._M_head_impl + 8))(_Var41._M_head_impl);
          }
        }
        else {
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(pbVar33->_M_dataplus)._M_p,
                               pbVar33->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,": close: ",9);
          piVar19 = __errno_location();
          pcVar21 = strerror(*piVar19);
          if (pcVar21 == (char *)0x0) {
            std::ios::clear((int)poVar20 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
          }
          else {
            sVar22 = strlen(pcVar21);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar21,sVar22);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
          std::ostream::put((char)poVar20);
          std::ostream::flush();
LAB_001812e7:
          local_218._0_8_ = (SimpleDescriptorDatabase *)0x0;
        }
        FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_1b0);
      }
      if ((FileDescriptor *)local_218._0_8_ == (FileDescriptor *)0x0) {
        local_228 = (MergedDescriptorDatabase *)0x0;
        goto LAB_00181ad3;
      }
      std::
      vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>
                ((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
                  *)&local_1d8,
                 (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                  *)local_218);
      if ((SimpleDescriptorDatabase *)local_218._0_8_ != (SimpleDescriptorDatabase *)0x0) {
        (**(code **)(*(long *)local_218._0_8_ + 8))();
      }
      pbVar33 = pbVar33 + 1;
    } while (pbVar33 != local_1e0);
    local_138._0_16_ = ZEXT816(0);
    local_138._16_8_ = 0;
    std::
    vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
    ::reserve((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
               *)local_138,
              (long)local_1d8.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar14 = local_1d8.
              super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1d8.
        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar42 = (Chunk *)local_1d8.
                         super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1b0._0_8_ = pCVar42->next;
        std::
        vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
        ::emplace_back<google::protobuf::DescriptorDatabase*>
                  ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
                    *)local_138,(DescriptorDatabase **)local_1b0);
        pCVar42 = (Chunk *)&pCVar42->size;
      } while (pCVar42 != (Chunk *)puVar14);
    }
    local_228 = (MergedDescriptorDatabase *)operator_new(0x20);
    MergedDescriptorDatabase::MergedDescriptorDatabase
              (local_228,
               (vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                *)local_138);
    if ((__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
         )local_138._0_8_ !=
        (__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
         )0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
  }
  pCVar34 = local_220;
  if ((local_220->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (local_220->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_248 = (SourceTreeDescriptorDatabase *)0x0;
    local_240 = (DiskSourceTree *)0x0;
    bVar15 = VerifyInputFilesInDescriptors(local_220,&local_228->super_DescriptorDatabase);
    if (!bVar15) {
LAB_00181ad3:
      iVar17 = 1;
      local_240 = (DiskSourceTree *)0x0;
      pSVar25 = (SourceTreeDescriptorDatabase *)0x0;
      goto LAB_00181ecf;
    }
    pMVar24 = (MultiFileErrorCollector *)operator_new(0x30);
    EVar1 = pCVar34->error_format_;
    pMVar24->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_00846e70;
    pMVar24[1]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_00846ec0;
    pMVar24[2]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_00846ef0;
    *(ErrorFormat *)&pMVar24[3]._vptr_MultiFileErrorCollector = EVar1;
    pMVar24[4]._vptr_MultiFileErrorCollector = (_func_int **)0x0;
    *(undefined2 *)&pMVar24[5]._vptr_MultiFileErrorCollector = 0;
    if (local_230 != (MultiFileErrorCollector *)0x0) {
      ppp_Var10 = &local_230->_vptr_MultiFileErrorCollector;
      local_230 = pMVar24;
      (*(*ppp_Var10)[1])();
      pMVar24 = local_230;
    }
    local_230 = pMVar24;
    pMVar24 = local_230;
    pDVar26 = (DescriptorPool *)operator_new(0x78);
    error_collector_00 = (ErrorCollector *)(pMVar24 + 2);
    if (pMVar24 == (MultiFileErrorCollector *)0x0) {
      error_collector_00 = (ErrorCollector *)0x0;
    }
    DescriptorPool::DescriptorPool(pDVar26,&local_228->super_DescriptorDatabase,error_collector_00);
    _Var11._M_head_impl = local_238._M_head_impl;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_138._8_8_;
    local_138._0_16_ = auVar9 << 0x40;
    bVar15 = local_238._M_head_impl != (DescriptorPool *)0x0;
    local_238._M_head_impl = pDVar26;
    if (bVar15) {
      DescriptorPool::~DescriptorPool(_Var11._M_head_impl);
      operator_delete(_Var11._M_head_impl,0x78);
    }
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                   *)local_138);
    local_248 = (SourceTreeDescriptorDatabase *)0x0;
    local_240 = (DiskSourceTree *)0x0;
  }
  else {
    this_02 = (DiskSourceTree *)operator_new(0x40);
    DiskSourceTree::DiskSourceTree(this_02);
    local_248 = (SourceTreeDescriptorDatabase *)0x0;
    local_240 = this_02;
    bVar15 = InitializeDiskSourceTree(pCVar34,this_02,&local_228->super_DescriptorDatabase);
    if (!bVar15) {
      iVar17 = 1;
      pSVar25 = (SourceTreeDescriptorDatabase *)0x0;
      goto LAB_00181ecf;
    }
    pMVar24 = (MultiFileErrorCollector *)operator_new(0x30);
    EVar1 = pCVar34->error_format_;
    pMVar24->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_00846e70;
    pMVar24[1]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_00846ec0;
    pMVar24[2]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_00846ef0;
    *(ErrorFormat *)&pMVar24[3]._vptr_MultiFileErrorCollector = EVar1;
    pMVar24[4]._vptr_MultiFileErrorCollector = (_func_int **)local_240;
    *(undefined2 *)&pMVar24[5]._vptr_MultiFileErrorCollector = 0;
    if (local_230 != (MultiFileErrorCollector *)0x0) {
      ppp_Var10 = &local_230->_vptr_MultiFileErrorCollector;
      local_230 = pMVar24;
      (*(*ppp_Var10)[1])();
      pMVar24 = local_230;
    }
    local_230 = pMVar24;
    pSVar25 = (SourceTreeDescriptorDatabase *)operator_new(0x78);
    SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
              (pSVar25,&local_240->super_SourceTree,&local_228->super_DescriptorDatabase);
    pSVar25->error_collector_ = local_230;
    pSVar25->using_validation_error_collector_ = true;
    local_248 = pSVar25;
    pDVar26 = (DescriptorPool *)operator_new(0x78);
    DescriptorPool::DescriptorPool
              (pDVar26,(DescriptorDatabase *)pSVar25,
               &(pSVar25->validation_error_collector_).super_ErrorCollector);
    _Var11._M_head_impl = local_238._M_head_impl;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_138._8_8_;
    local_138._0_16_ = auVar8 << 0x40;
    bVar15 = local_238._M_head_impl != (DescriptorPool *)0x0;
    local_238._M_head_impl = pDVar26;
    if (bVar15) {
      DescriptorPool::~DescriptorPool(_Var11._M_head_impl);
      operator_delete(_Var11._M_head_impl,0x78);
    }
    std::
    unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
    ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                   *)local_138);
  }
  (local_238._M_head_impl)->enforce_weak_ = true;
  (local_238._M_head_impl)->enforce_naming_style_ = true;
  bVar15 = SetupFeatureResolution(pCVar34,local_238._M_head_impl);
  iVar17 = 1;
  pSVar25 = local_248;
  if (!bVar15) goto LAB_00181ecf;
  if (pCVar34->mode_ == MODE_COMPILE) {
    (local_238._M_head_impl)->enforce_extension_declarations_ = kCustomExtensions;
  }
  bVar15 = ParseInputFiles(pCVar34,local_238._M_head_impl,source_tree,&local_1f8);
  ppFVar13 = local_1f8.
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pSVar25 = local_248;
  if (!bVar15) goto LAB_00181ecf;
  local_249 = ~kSentinel;
  if (local_1f8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var39._M_p = (__pointer_type)
                  local_1f8.
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar2 = *(size_type *)_Var39._M_p;
      local_138._8_8_ = (slot_type *)&local_230;
      local_138._0_8_ = &local_249;
      if (0 < *(int *)(sVar2 + 0x3c)) {
        lVar36 = 0;
        lVar37 = 0;
        do {
          protobuf::internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
          ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
                     *)local_138,(Descriptor *)(*(long *)(sVar2 + 0x60) + lVar36));
          lVar37 = lVar37 + 1;
          lVar36 = lVar36 + 0xa0;
        } while (lVar37 < *(int *)(sVar2 + 0x3c));
      }
      if (0 < *(int *)(sVar2 + 4)) {
        lVar36 = 0;
        lVar37 = 0;
        do {
          protobuf::internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
          ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
                     *)local_138,(FieldDescriptor *)(*(long *)(sVar2 + 0x78) + lVar36));
          lVar37 = lVar37 + 1;
          lVar36 = lVar36 + 0x58;
        } while (lVar37 < *(int *)(sVar2 + 4));
      }
      _Var39._M_p = _Var39._M_p + 8;
    } while (_Var39._M_p != (__pointer_type)ppFVar13);
  }
  local_1b8 = (pointer)local_1f8.
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  _Var39._M_p = (__pointer_type)
                local_1f8.
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (local_1f8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_218._0_8_ = *(undefined8 *)_Var39._M_p;
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_138,(Arena *)0x0);
      FileDescriptor::CopyTo((FileDescriptor *)local_218._0_8_,(FileDescriptorProto *)local_138);
      uVar12 = local_218._0_8_;
      local_1b0._0_8_ = &local_238;
      local_1b0._8_8_ = &local_230;
      local_1b0._16_8_ = local_218;
      local_1b0._24_8_ = &local_249;
      puVar35 = (undefined1 *)local_70[3];
      if (local_70[3].tagged_ptr_.ptr_ == (void *)0x0) {
        puVar35 = _FileOptions_default_instance_;
      }
      pnVar3 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                (local_218._0_8_ + 8))->by_name_).
               super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
               .
               super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
               .
               super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
               .tree_.root_;
      file_name._M_str = (char *)0x1;
      file_name._M_len = *(size_t *)pnVar3;
      bVar15 = anon_unknown_5::ValidateTargetConstraints
                         ((anon_unknown_5 *)puVar35,(Message *)local_238._M_head_impl,
                          (DescriptorPool *)(local_230 + 2),*(ErrorCollector **)(pnVar3 + 8),
                          file_name,in_stack_fffffffffffffda8);
      if (!bVar15) {
        local_249 = ~kDeleted;
      }
      local_1e0 = (pointer)_Var39._M_p;
      if (0 < *(int *)(uVar12 + 0x3c)) {
        lVar37 = 0;
        lVar36 = 0;
        do {
          pDVar4 = *(Descriptor **)(uVar12 + 0x60);
          proto = protobuf::internal::RepeatedPtrFieldBase::
                  Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                            ((RepeatedPtrFieldBase *)(local_138 + 0x30),(int)lVar36);
          protobuf::internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
          ::Visit<google::protobuf::DescriptorProto>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
                      *)local_1b0,
                     (Descriptor *)
                     ((long)&(((__uniq_ptr_data<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>,_true,_true>
                                *)&pDVar4->super_SymbolBase)->
                             super___uniq_ptr_impl<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>
                             )._M_t.
                             super__Tuple_impl<0UL,_const_google::protobuf::FileDescriptorProto_*,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>
                             .
                             super__Head_base<0UL,_const_google::protobuf::FileDescriptorProto_*,_false>
                             ._M_head_impl + lVar37),proto);
          lVar36 = lVar36 + 1;
          lVar37 = lVar37 + 0xa0;
        } while (lVar36 < *(int *)(uVar12 + 0x3c));
      }
      if (0 < *(int *)&(((CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>
                          *)(uVar12 + 0x40))->
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       ).
                       super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*,_2UL,_false>
                       .value) {
        lVar37 = 0;
        lVar36 = 0;
        do {
          pp_Var5 = (((SimpleDescriptorDatabase *)(uVar12 + 0x68))->super_DescriptorDatabase).
                    _vptr_DescriptorDatabase;
          proto_00 = protobuf::internal::RepeatedPtrFieldBase::
                     Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                               (&local_f0,(int)lVar36);
          protobuf::internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
          ::Visit<google::protobuf::EnumDescriptorProto>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
                      *)local_1b0,(EnumDescriptor *)((long)pp_Var5 + lVar37),proto_00);
          lVar36 = lVar36 + 1;
          lVar37 = lVar37 + 0x58;
        } while (lVar36 < *(int *)&(((CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>
                                      *)(uVar12 + 0x40))->
                                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                   ).
                                   super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*,_2UL,_false>
                                   .value);
      }
      if (0 < *(int *)(uVar12 + 4)) {
        lVar36 = 0;
        do {
          descriptor = protobuf::internal::RepeatedPtrFieldBase::
                       Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                 (local_c0,(int)lVar36);
          protobuf::internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
          ::Visit<google::protobuf::FieldDescriptorProto>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
                      *)local_1b0,(FieldDescriptor *)descriptor,proto_01);
          lVar36 = lVar36 + 1;
        } while (lVar36 < *(int *)(uVar12 + 4));
      }
      if (0 < *(int *)(uVar12 + 0x44)) {
        lVar36 = 0;
        do {
          pnVar3 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                    (uVar12 + 0x70))->by_name_).
                   super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                   .
                   super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                   .tree_.root_;
          pVVar27 = protobuf::internal::RepeatedPtrFieldBase::
                    Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (&local_d8,(int)lVar36);
          puVar35 = (undefined1 *)(pVVar27->field_0)._impl_.options_;
          if ((ServiceOptions *)puVar35 == (ServiceOptions *)0x0) {
            puVar35 = _ServiceOptions_default_instance_;
          }
          pnVar6 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                    (local_218._0_8_ + 8))->by_name_).
                   super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                   .
                   super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                   .tree_.root_;
          file_name_00._M_str = &DAT_00000008;
          file_name_00._M_len = *(size_t *)pnVar6;
          bVar15 = anon_unknown_5::ValidateTargetConstraints
                             ((anon_unknown_5 *)puVar35,(Message *)local_238._M_head_impl,
                              (DescriptorPool *)(local_230 + 2),*(ErrorCollector **)(pnVar6 + 8),
                              file_name_00,in_stack_fffffffffffffda8);
          if (!bVar15) {
            local_249 = ~kDeleted;
          }
          if (0 < *(int *)(pnVar3 + lVar36 * 0x40 + 0x38)) {
            iVar17 = 0;
            do {
              pVVar28 = protobuf::internal::RepeatedPtrFieldBase::
                        Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                  (&(pVVar27->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                                   iVar17);
              puVar35 = (undefined1 *)(pVVar28->field_0)._impl_.options_;
              if ((MethodOptions *)puVar35 == (MethodOptions *)0x0) {
                puVar35 = _MethodOptions_default_instance_;
              }
              pnVar6 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                        (local_218._0_8_ + 8))->by_name_).
                       super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                       .
                       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                       .
                       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                       .tree_.root_;
              file_name_01._M_str = (char *)0x9;
              file_name_01._M_len = *(size_t *)pnVar6;
              bVar15 = anon_unknown_5::ValidateTargetConstraints
                                 ((anon_unknown_5 *)puVar35,(Message *)local_238._M_head_impl,
                                  (DescriptorPool *)(local_230 + 2),*(ErrorCollector **)(pnVar6 + 8)
                                  ,file_name_01,in_stack_fffffffffffffda8);
              if (!bVar15) {
                local_249 = ~kDeleted;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 < *(int *)(pnVar3 + lVar36 * 0x40 + 0x38));
          }
          lVar36 = lVar36 + 1;
        } while (lVar36 < *(int *)(uVar12 + 0x44));
      }
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_138);
      _Var39._M_p = (__pointer_type)&local_1e0->_M_string_length;
    } while ((pointer)&local_1e0->_M_string_length != local_1b8);
  }
  pCVar34 = local_220;
  iVar17 = 1;
  pSVar25 = local_248;
  if (local_249 != ~kSentinel) goto LAB_00181ecf;
  bVar15 = EnforceProtocEditionsSupport(local_220,&local_1f8);
  pSVar25 = local_248;
  if (!bVar15) goto LAB_00181ecf;
  local_218._0_8_ =
       (__uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
        )0x0;
  local_218._8_8_ = 0;
  local_218._16_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  if ((pCVar34->mode_ == MODE_COMPILE) &&
     (pOVar29 = (pCVar34->output_directives_).
                super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (pCVar34->output_directives_).
     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
     ._M_impl.super__Vector_impl_data._M_finish != pOVar29)) {
    lVar36 = 0;
    uVar40 = 0;
    do {
      local_138._0_8_ = (long)local_138 + 0x10;
      lVar37 = *(long *)((long)&(pOVar29->output_location)._M_dataplus._M_p + lVar36);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,lVar37,
                 *(long *)((long)&(pOVar29->output_location)._M_string_length + lVar36) + lVar37);
      if ((((ulong)local_138._8_8_ < (slot_type *)0x4) ||
          (*(undefined4 *)((ctrl_t *)(local_138._0_8_ + -4) + local_138._8_8_) != 0x70697a2e)) &&
         (((ulong)local_138._8_8_ < (slot_type *)0x4 ||
          (*(undefined4 *)((ctrl_t *)(local_138._0_8_ + -4) + local_138._8_8_) != 0x72616a2e)))) {
        if ((slot_type *)&DAT_00000006 < (ulong)local_138._8_8_) {
          if (*(undefined4 *)((ctrl_t *)(local_138._0_8_ + -4) + local_138._8_8_) != 0x72616a63 ||
              *(undefined4 *)((ctrl_t *)(local_138._0_8_ + -7) + local_138._8_8_) != 0x6372732e)
          goto LAB_00181c3c;
        }
        else if ((slot_type *)local_138._8_8_ != (slot_type *)0x0) {
LAB_00181c3c:
          if (((ctrl_t *)(local_138._0_8_ + -1))[local_138._8_8_] != 0x2f) {
            std::__cxx11::string::push_back
                      ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138);
          }
        }
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
      ::try_emplace_impl<std::__cxx11::string_const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>::iterator,_bool>
                  *)local_1b0,local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
      uVar12 = local_1b0._8_8_;
      if (*(MultiFileErrorCollector **)(local_1b0._8_8_ + 0x20) == (MultiFileErrorCollector *)0x0) {
        pMVar30 = (MultiFileErrorCollector *)operator_new(0x30);
        pMVar30->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__GeneratorContextImpl_00846d38;
        pMVar30[1]._vptr_MultiFileErrorCollector =
             (_func_int **)
             absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
             ::EmptyNode()::empty_node_abi_cxx11_;
        pMVar30[2]._vptr_MultiFileErrorCollector =
             (_func_int **)
             absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
             ::EmptyNode()::empty_node_abi_cxx11_;
        pMVar30[3]._vptr_MultiFileErrorCollector = (_func_int **)0x0;
        pMVar30[4]._vptr_MultiFileErrorCollector = (_func_int **)&local_1f8;
        *(undefined1 *)&pMVar30[5]._vptr_MultiFileErrorCollector = 0;
        pMVar24 = *(MultiFileErrorCollector **)(uVar12 + 0x20);
        *(MultiFileErrorCollector **)(uVar12 + 0x20) = pMVar30;
        if (pMVar24 != (MultiFileErrorCollector *)0x0) {
          (*pMVar24->_vptr_MultiFileErrorCollector[1])();
        }
      }
      bVar15 = GenerateOutput(local_220,&local_1f8,
                              (OutputDirective *)
                              ((long)&(((local_220->output_directives_).
                                        super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->name).
                                      _M_dataplus._M_p + lVar36),
                              *(GeneratorContext **)(uVar12 + 0x20));
      if (local_138._0_8_ != (long)local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if (!bVar15) goto LAB_00181ebb;
      uVar40 = uVar40 + 1;
      pOVar29 = (local_220->output_directives_).
                super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar36 = lVar36 + 0x68;
      pCVar34 = local_220;
    } while (uVar40 < (ulong)(((long)(local_220->output_directives_).
                                     super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar29 >> 3
                              ) * 0x4ec4ec4ec4ec4ec5));
  }
  local_138._0_16_ =
       (undefined1  [16])
       absl::lts_20250127::container_internal::
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
       ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                *)local_218);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
              *)local_218);
  local_1b0._0_8_ = (__pointer_type)0x0;
  while (bVar15 = absl::lts_20250127::container_internal::operator==
                            ((iterator *)local_138,(iterator *)local_1b0), !bVar15) {
    filename = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
               ::iterator::operator*((iterator *)local_138);
    this_00 = (filename->second)._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
              .
              super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
              ._M_head_impl;
    pcVar7 = (filename->first)._M_dataplus._M_p;
    uVar40 = (filename->first)._M_string_length;
    if ((uVar40 == 0) || (pcVar7[uVar40 - 1] != '/')) {
      if ((3 < uVar40) && (*(int *)(pcVar7 + (uVar40 - 4)) == 0x72616a2e)) {
        GeneratorContextImpl::AddJarManifest(this_00);
      }
      bVar15 = GeneratorContextImpl::WriteAllToZip(this_00,&filename->first);
    }
    else {
      bVar15 = GeneratorContextImpl::WriteAllToDisk(this_00,&filename->first);
    }
    if (bVar15 == false) goto LAB_00181ebb;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
    ::iterator::operator++((iterator *)local_138);
  }
  if ((pCVar34->dependency_out_name_)._M_string_length != 0) {
    if (local_240 == (DiskSourceTree *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0x55f,"disk_source_tree.get()");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_138);
    }
    bVar15 = GenerateDependencyManifestFile
                       (pCVar34,&local_1f8,(GeneratorContextMap *)local_218,local_240);
    iVar17 = 1;
    if (bVar15) goto LAB_00181b18;
    goto LAB_00181ec0;
  }
LAB_00181b18:
  if ((pCVar34->descriptor_set_out_name_)._M_string_length != 0) {
    bVar15 = WriteDescriptorSet(pCVar34,&local_1f8);
    iVar17 = 1;
    if (!bVar15) goto LAB_00181ec0;
  }
  if ((pCVar34->edition_defaults_out_name_)._M_string_length != 0) {
    bVar15 = WriteEditionDefaults(pCVar34,local_238._M_head_impl);
    iVar17 = 1;
    if (!bVar15) goto LAB_00181ec0;
  }
  if (pCVar34->mode_ - MODE_ENCODE < 2) {
    if ((pCVar34->codec_type_)._M_string_length == 0) {
      DescriptorPool::DescriptorPool((DescriptorPool *)local_1b0);
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_138,(Arena *)0x0);
      local_138._16_8_ = local_138._16_8_ | 1;
      arena = (anon_union_8_1_a8a14541_for_iterator_2)local_138._8_8_;
      if ((local_138._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        arena = (anon_union_8_1_a8a14541_for_iterator_2)
                ((anon_union_8_1_a8a14541_for_iterator_2 *)(local_138._8_8_ & 0xfffffffffffffffe))->
                slot_;
      }
      value._M_str = "empty_message.proto";
      value._M_len = 0x13;
      protobuf::internal::ArenaStringPtr::Set(local_70,value,(Arena *)arena.slot_);
      pvVar31 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                          ((RepeatedPtrFieldBase *)(local_138 + 0x30),
                           Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      *(byte *)((long)pvVar31 + 0x10) = *(byte *)((long)pvVar31 + 0x10) | 1;
      arena_00 = *(Arena **)((long)pvVar31 + 8);
      if (((ulong)arena_00 & 1) != 0) {
        arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
      }
      value_00._M_str = "EmptyMessage";
      value_00._M_len = 0xc;
      protobuf::internal::ArenaStringPtr::Set
                ((ArenaStringPtr *)((long)pvVar31 + 0xd8),value_00,arena_00);
      pFVar32 = DescriptorPool::BuildFile
                          ((DescriptorPool *)local_1b0,(FileDescriptorProto *)local_138);
      if (pFVar32 == (FileDescriptor *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                   ,0x579,"pool.BuildFile(file) != nullptr");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      std::__cxx11::string::operator=((string *)&local_220->codec_type_,"EmptyMessage");
      bVar15 = EncodeOrDecode(local_220,(DescriptorPool *)local_1b0);
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_138);
      DescriptorPool::~DescriptorPool((DescriptorPool *)local_1b0);
      iVar17 = 1;
      pCVar34 = local_220;
      if (bVar15) goto LAB_00181e3f;
    }
    else {
      bVar15 = EncodeOrDecode(pCVar34,local_238._M_head_impl);
      iVar17 = 1;
      if (bVar15) goto LAB_00181e3f;
    }
  }
  else {
LAB_00181e3f:
    iVar17 = 1;
    if ((*(char *)&local_230[5]._vptr_MultiFileErrorCollector == '\0') &&
       ((pCVar34->fatal_warnings_ != true ||
        (*(char *)((long)&local_230[5]._vptr_MultiFileErrorCollector + 1) == '\0')))) {
      iVar17 = 0;
      if (pCVar34->mode_ == MODE_PRINT) {
        iVar17 = 0;
        if (pCVar34->print_mode_ == PRINT_FREE_FIELDS) {
          if (local_1f8.
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1f8.
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar40 = 0;
            do {
              lVar36 = *(long *)((long)local_1f8.
                                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar40 * 8);
              if (0 < *(int *)(lVar36 + 0x3c)) {
                lVar43 = 0;
                lVar37 = 0;
                do {
                  PrintFreeFieldNumbers(pCVar34,(Descriptor *)(*(long *)(lVar36 + 0x60) + lVar43));
                  lVar37 = lVar37 + 1;
                  lVar43 = lVar43 + 0xa0;
                } while (lVar37 < *(int *)(lVar36 + 0x3c));
              }
              uVar40 = uVar40 + 1;
              iVar17 = 0;
            } while (uVar40 < (ulong)((long)local_1f8.
                                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1f8.
                                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        else if (pCVar34->print_mode_ == PRINT_NONE) {
          absl::lts_20250127::log_internal::LogMessage::LogMessage
                    ((LogMessage *)local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,0x595);
          str._M_str = 
          "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
          ;
          str._M_len = 0x5d;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_138,str);
          absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_138);
LAB_00181ebb:
          iVar17 = 1;
        }
      }
    }
  }
LAB_00181ec0:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                   *)local_218);
  pSVar25 = local_248;
LAB_00181ecf:
  if (pSVar25 != (SourceTreeDescriptorDatabase *)0x0) {
    (*(pSVar25->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
  }
  if (local_228 != (MergedDescriptorDatabase *)0x0) {
    (*(local_228->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
  }
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector(&local_1d8);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&local_238);
  if (local_230 != (MultiFileErrorCollector *)0x0) {
    (*local_230->_vptr_MultiFileErrorCollector[1])();
  }
  if (local_240 != (DiskSourceTree *)0x0) {
    (*(local_240->super_SourceTree)._vptr_SourceTree[1])();
  }
  if ((__pointer_type)
      local_1f8.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (__pointer_type)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar17;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();

  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database = std::make_unique<MergedDescriptorDatabase>(
        raw_databases_per_descriptor_set);
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector = std::make_unique<ErrorPrinter>(error_format_);
    descriptor_pool = std::make_unique<DescriptorPool>(
        descriptor_set_in_database.get(), error_collector.get());
  } else {
    disk_source_tree = std::make_unique<DiskSourceTree>();
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector =
        std::make_unique<ErrorPrinter>(error_format_, disk_source_tree.get());

    source_tree_database = std::make_unique<SourceTreeDescriptorDatabase>(
        disk_source_tree.get(), descriptor_set_in_database.get());
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool = std::make_unique<DescriptorPool>(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector());
  }

  descriptor_pool->EnforceWeakDependencies(true);
  descriptor_pool->EnforceNamingStyle(true);

  if (!SetupFeatureResolution(*descriptor_pool)) {
    return EXIT_FAILURE;
  }

  // Enforce extension declarations only when compiling. We want to skip this
  // enforcement when protoc is just being invoked to encode or decode
  // protos. If allowlist is disabled, we will not check for descriptor
  // extensions declarations, either.
  if (mode_ == MODE_COMPILE) {
      descriptor_pool->EnforceExtensionDeclarations(
          ExtDeclEnforcementLevel::kCustomExtensions);
  }
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }

  bool validation_error = false;  // Defer exiting so we log more warnings.

  for (auto& file : parsed_files) {
    google::protobuf::internal::VisitDescriptors(
        *file, [&](const FieldDescriptor& field) {
          if (HasReservedFieldNumber(&field)) {
            const char* error_link = nullptr;
            validation_error = true;
            std::string error;
            if (field.number() >= FieldDescriptor::kFirstReservedNumber &&
                field.number() <= FieldDescriptor::kLastReservedNumber) {
              error = absl::Substitute(
                  "Field numbers $0 through $1 are reserved "
                  "for the protocol buffer library implementation.",
                  FieldDescriptor::kFirstReservedNumber,
                  FieldDescriptor::kLastReservedNumber);
            } else {
              error = absl::Substitute(
                  "Field number $0 is reserved for specific purposes.",
                  field.number());
            }
            if (error_link) {
              absl::StrAppend(&error, "(See ", error_link, ")");
            }
            static_cast<DescriptorPool::ErrorCollector*>(error_collector.get())
                ->RecordError(field.file()->name(), field.full_name(), nullptr,
                              DescriptorPool::ErrorCollector::NUMBER, error);
          }
        });
  }

  // We visit one file at a time because we need to provide the file name for
  // error messages. Usually we can get the file name from any descriptor with
  // something like descriptor->file()->name(), but ExtensionRange does not
  // support this.
  for (const google::protobuf::FileDescriptor* file : parsed_files) {
    FileDescriptorProto proto;
    file->CopyTo(&proto);
    google::protobuf::internal::VisitDescriptors(
        *file, proto, [&](const auto& descriptor, const auto& proto) {
          if (!ValidateTargetConstraints(proto.options(), *descriptor_pool,
                                         *error_collector, file->name(),
                                         GetTargetType(&descriptor))) {
            validation_error = true;
          }
        });
  }


  if (validation_error) {
    return 1;
  }

  if (!EnforceProtocEditionsSupport(parsed_files)) {
    return 1;
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (size_t i = 0; i < output_directives_.size(); ++i) {
      std::string output_location = output_directives_[i].output_location;
      if (!absl::EndsWith(output_location, ".zip") &&
          !absl::EndsWith(output_location, ".jar") &&
          !absl::EndsWith(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator = std::make_unique<GeneratorContextImpl>(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (absl::EndsWith(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (absl::EndsWith(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    ABSL_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (!edition_defaults_out_name_.empty()) {
    if (!WriteEditionDefaults(*descriptor_pool)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      ABSL_CHECK(pool.BuildFile(file) != nullptr);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (size_t i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        ABSL_LOG(ERROR)
            << "If the code reaches here, it usually means a bug of "
               "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }
  return 0;
}